

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

uint32_t pack_tiles_in_tg_obus
                   (AV1_COMP *cpi,uint8_t *dst,aom_write_bit_buffer *saved_wb,
                   uint8_t obu_extension_header,FrameHeaderInfo *fh_info,int *largest_tile_id)

{
  int num_tiles_00;
  int iVar1;
  int *piVar2;
  undefined1 in_CL;
  uint8_t *in_RDX;
  uint32_t unaff_EBX;
  AV1_COMP *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  uint32_t *in_R9;
  uint8_t *unaff_R14;
  int num_workers;
  int num_tiles;
  int tile_rows;
  int tile_cols;
  uint8_t *tile_data_start;
  uint32_t obu_header_size;
  uint max_tile_size;
  uint32_t total_size;
  CommonTileParams *tiles;
  undefined7 in_stack_00000068;
  int *in_stack_00000090;
  uint *in_stack_00000098;
  uint32_t *in_stack_000000a0;
  uint8_t **in_stack_000000a8;
  FrameHeaderInfo *in_stack_0000b7a0;
  uint8_t in_stack_0000b7af;
  aom_write_bit_buffer *in_stack_0000b7b0;
  uint32_t *in_stack_0000b7b8;
  uint8_t *in_stack_0000b7c0;
  AV1_COMP *in_stack_0000b7c8;
  int *in_stack_0000b7e0;
  uint *in_stack_0000b7e8;
  uint32_t *in_stack_0000b7f0;
  uint8_t **in_stack_0000b7f8;
  int in_stack_0000b800;
  uint max_tile_size_00;
  int largest_tile_id_00;
  undefined7 in_stack_ffffffffffffffd0;
  
  largest_tile_id_00 = (int)((ulong)in_R8 >> 0x20);
  piVar2 = (int *)(in_RDI + 0x42020);
  num_tiles_00 = *(int *)(in_RDI + 0x42024) * *piVar2;
  iVar1 = calc_pack_bs_mt_workers
                    (*(TileDataEnc **)(in_RDI + 0x71318),num_tiles_00,*(int *)(in_RDI + 0x9ae70),
                     (_Bool)(*(byte *)(in_RDI + 0x9ae91) & 1));
  max_tile_size_00 = (uint)((ulong)piVar2 >> 0x20);
  if (iVar1 < 2) {
    write_tile_obu((AV1_COMP *)dst,(uint8_t *)saved_wb,
                   (uint32_t *)CONCAT17(obu_extension_header,in_stack_00000068),
                   (aom_write_bit_buffer *)fh_info,largest_tile_id._7_1_,(FrameHeaderInfo *)tiles,
                   in_stack_00000090,in_stack_00000098,in_stack_000000a0,in_stack_000000a8);
  }
  else {
    av1_write_tile_obu_mt
              (in_stack_0000b7c8,in_stack_0000b7c0,in_stack_0000b7b8,in_stack_0000b7b0,
               in_stack_0000b7af,in_stack_0000b7a0,in_stack_0000b7e0,in_stack_0000b7e8,
               in_stack_0000b7f0,in_stack_0000b7f8,in_stack_0000b800);
  }
  if (1 < num_tiles_00) {
    write_tile_obu_size(in_RSI,in_RDX,
                        (aom_write_bit_buffer *)CONCAT17(in_CL,in_stack_ffffffffffffffd0),
                        largest_tile_id_00,in_R9,max_tile_size_00,unaff_EBX,unaff_R14);
  }
  return 0;
}

Assistant:

static inline uint32_t pack_tiles_in_tg_obus(
    AV1_COMP *const cpi, uint8_t *const dst,
    struct aom_write_bit_buffer *saved_wb, uint8_t obu_extension_header,
    const FrameHeaderInfo *fh_info, int *const largest_tile_id) {
  const CommonTileParams *const tiles = &cpi->common.tiles;
  uint32_t total_size = 0;
  unsigned int max_tile_size = 0;
  uint32_t obu_header_size = 0;
  uint8_t *tile_data_start = dst;
  const int tile_cols = tiles->cols;
  const int tile_rows = tiles->rows;
  const int num_tiles = tile_rows * tile_cols;

  const int num_workers = calc_pack_bs_mt_workers(
      cpi->tile_data, num_tiles, cpi->mt_info.num_mod_workers[MOD_PACK_BS],
      cpi->mt_info.pack_bs_mt_enabled);

  if (num_workers > 1) {
    av1_write_tile_obu_mt(cpi, dst, &total_size, saved_wb, obu_extension_header,
                          fh_info, largest_tile_id, &max_tile_size,
                          &obu_header_size, &tile_data_start, num_workers);
  } else {
    write_tile_obu(cpi, dst, &total_size, saved_wb, obu_extension_header,
                   fh_info, largest_tile_id, &max_tile_size, &obu_header_size,
                   &tile_data_start);
  }

  if (num_tiles > 1)
    write_tile_obu_size(cpi, dst, saved_wb, *largest_tile_id, &total_size,
                        max_tile_size, obu_header_size, tile_data_start);
  return total_size;
}